

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O3

QFixed __thiscall QTextEngine::width(QTextEngine *this,int from,int len)

{
  unsigned_short *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  QFixed QVar5;
  LayoutData *pLVar6;
  unsigned_short *puVar7;
  ulong uVar8;
  ulong uVar9;
  QScriptItem *pQVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  QFixed x;
  
  itemize(this);
  pLVar6 = this->layoutData;
  if ((pLVar6->items).d.size == 0) {
    x.val = 0;
  }
  else {
    x.val = 0;
    uVar16 = 0;
    do {
      pQVar10 = (pLVar6->items).d.ptr;
      uVar13 = pQVar10[uVar16].position;
      iVar15 = (int)uVar16;
      uVar3 = length(this,iVar15);
      if (len + from <= (int)uVar13) {
        return (QFixed)x.val;
      }
      if (from < (int)(uVar3 + uVar13)) {
        pQVar10 = pQVar10 + uVar16;
        if (pQVar10->num_glyphs == 0) {
          shape(this,iVar15);
        }
        uVar4 = (uint)pQVar10->analysis >> 8 & 0xf;
        if (uVar4 == 7) {
          QVar5 = calculateTabWidth(this,iVar15,x);
        }
        else {
          if (uVar4 != 8) {
            pLVar6 = this->layoutData;
            iVar15 = pQVar10->position;
            puVar1 = pLVar6->logClustersPtr;
            uVar4 = from - uVar13;
            uVar8 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar8 = 0;
            }
            else if (((int)uVar4 < (int)uVar3) &&
                    (lVar2 = (long)iVar15 + uVar8,
                    puVar1[(long)iVar15 + (uVar8 - 1)] == puVar1[lVar2])) {
              do {
                if (puVar1[(long)iVar15 + uVar8] != puVar1[lVar2]) goto LAB_004ff1de;
                uVar8 = uVar8 + 1;
              } while (uVar3 != uVar8);
              goto LAB_004ff278;
            }
LAB_004ff1de:
            if ((int)uVar8 < (int)uVar3) {
              iVar11 = ~uVar13 + len + from;
              iVar12 = uVar3 - 1;
              if (iVar11 < (int)uVar3) {
                iVar12 = iVar11;
              }
              uVar9 = (ulong)puVar1[(long)iVar15 + (long)(int)uVar8];
              lVar14 = (long)iVar12;
              lVar2 = iVar15 + lVar14;
              uVar13 = iVar12 + 1U;
              if ((int)(iVar12 + 1U) < (int)uVar3) {
                uVar13 = uVar3;
              }
              do {
                if (puVar1[iVar15 + lVar14] != puVar1[lVar2]) {
                  uVar13 = (uint)lVar14;
                  break;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < (int)uVar3);
              puVar7 = puVar1 + (long)iVar15 + (long)(int)uVar13;
              if (uVar13 == uVar3) {
                puVar7 = &pQVar10->num_glyphs;
              }
              if (puVar1[(long)iVar15 + (long)(int)uVar8] < *puVar7) {
                do {
                  iVar15 = 0;
                  if (((byte)(pLVar6->glyphLayout).attributes
                             [uVar9 + (long)pQVar10->glyph_data_offset] & 2) == 0) {
                    iVar15 = (pLVar6->glyphLayout).advances
                             [(long)pQVar10->glyph_data_offset + uVar9].val;
                  }
                  x.val = x.val + iVar15;
                  uVar9 = uVar9 + 1;
                } while (*puVar7 != uVar9);
              }
            }
            goto LAB_004ff278;
          }
          QVar5.val = (pQVar10->width).val;
        }
        x.val = x.val + QVar5.val;
      }
LAB_004ff278:
      uVar16 = uVar16 + 1;
      pLVar6 = this->layoutData;
    } while (uVar16 < (ulong)(pLVar6->items).d.size);
  }
  return (QFixed)x.val;
}

Assistant:

QFixed QTextEngine::width(int from, int len) const
{
    itemize();

    QFixed w = 0;
//     qDebug("QTextEngine::width(from = %d, len = %d), numItems=%d, strleng=%d", from,  len, items.size(), string.length());
    textIterator(this, from, len, w, [this, &w](int glyphStart, int glyphEnd, const QScriptItem *si) {
        QGlyphLayout glyphs = this->shapedGlyphs(si);
        for (int j = glyphStart; j < glyphEnd; j++)
            w += glyphs.advances[j] * !glyphs.attributes[j].dontPrint;
    });
//     qDebug("   --> w= %d ", w);
    return w;
}